

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void cmCacheManager::OutputKey(ostream *fout,string *key)

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  
  lVar1 = std::__cxx11::string::find((char)key,0x3a);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)key,0x4dc2bd,0);
    __s = "";
    if (lVar1 == 0) {
      __s = "\"";
    }
  }
  else {
    __s = "\"";
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(fout,__s,sVar2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,(key->_M_dataplus)._M_p,key->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  return;
}

Assistant:

void cmCacheManager::OutputKey(std::ostream& fout, std::string const& key)
{
  // support : in key name by double quoting
  const char* q =
    (key.find(':') != std::string::npos || key.find("//") == 0) ? "\"" : "";
  fout << q << key << q;
}